

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Matlab.cpp
# Opt level: O1

double __thiscall chrono::ChFunction_Matlab::Get_y(ChFunction_Matlab *this,double x)

{
  return 0.0;
}

Assistant:

double ChFunction_Matlab::Get_y(double x) const {
    double ret = 0;

#ifdef CH_MATLAB
    char m_eval_command[CHF_MATLAB_STRING_LEN + 20];

    // no function: shortcut!
    if (*this->mat_command == NULL)
        return 0.0;

    // set string as "x=[x];ans=[mat_command]"
    sprintf(m_eval_command, "x=%g;ans=%s;", x, this->mat_command);

    // EVAL string, retrieving y = "ans"
    ret = CHGLOBALS().Mat_Eng_Eval(m_eval_command);
#endif

    return ret;
}